

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O3

void save_to_check_buffer_and_read_at_least_again
               (cio_buffered_stream *bs,void *context,cio_error err,cio_read_buffer *buffer,
               size_t num_bytes)

{
  size_t sVar1;
  cio_error cVar2;
  size_t num;
  
  sVar1 = first_check_buffer_pos;
  if (err == CIO_SUCCESS) {
    memcpy(first_check_buffer + first_check_buffer_pos,buffer->fetch_ptr,num_bytes);
    buffer->fetch_ptr = buffer->fetch_ptr + num_bytes;
    first_check_buffer_pos = sVar1 + num_bytes;
  }
  num = strlen((char *)context);
  cVar2 = cio_buffered_stream_read_at_least(bs,buffer,num,second_dummy_read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Call to read_at_least did not succeed!",0x15e,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void save_to_check_buffer_and_read_at_least_again(struct cio_buffered_stream *bs, void *context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	char *second_chunk = context;

	save_to_check_buffer(bs, context, err, buffer, num_bytes);
	err = cio_buffered_stream_read_at_least(bs, buffer, strlen(second_chunk), second_dummy_read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Call to read_at_least did not succeed!");
}